

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

int __thiscall embree::CommandLineStream::next(CommandLineStream *this)

{
  size_t sVar1;
  pointer pbVar2;
  size_type sVar3;
  int iVar4;
  
  sVar1 = this->i;
  pbVar2 = (this->args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar1 == (long)(this->args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) {
    iVar4 = -1;
  }
  else {
    sVar3 = this->j;
    if (sVar3 != pbVar2[sVar1]._M_string_length) {
      this->charNumber = this->charNumber + 1;
      this->j = sVar3 + 1;
      return (int)pbVar2[sVar1]._M_dataplus._M_p[sVar3];
    }
    this->i = sVar1 + 1;
    this->j = 0;
    this->charNumber = this->charNumber + 1;
    iVar4 = 0x20;
  }
  return iVar4;
}

Assistant:

int next() {
      if (i == args.size()) return EOF;
      if (j == args[i].size()) { i++; j=0; charNumber++; return ' '; }
      charNumber++;
      return args[i][j++];
    }